

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html_tree_renderer.cpp
# Opt level: O0

string * duckdb::CreateTreeRecursive_abi_cxx11_(RenderTree *root,idx_t x,idx_t y)

{
  bool bVar1;
  RenderTreeNode *__lhs;
  RenderTreeNode *this;
  idx_t in_RCX;
  RenderTree *in_RDX;
  string *in_RDI;
  Coordinate *coord;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::RenderTreeNode::Coordinate,_true> *__range2;
  optional_ptr<duckdb::RenderTreeNode,_true> node;
  string *result;
  idx_t in_stack_ffffffffffffff38;
  optional_ptr<duckdb::RenderTreeNode,_true> *in_stack_ffffffffffffff40;
  RenderTree *in_stack_ffffffffffffff48;
  string *this_00;
  string local_a0 [32];
  reference local_80;
  Coordinate *local_78;
  __normal_iterator<duckdb::RenderTreeNode::Coordinate_*,_std::vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>_>
  local_70;
  vector<duckdb::RenderTreeNode::Coordinate,_true> *local_68;
  RenderTreeNode *local_60;
  string local_58 [48];
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar2;
  
  uVar2 = 0;
  this_00 = in_RDI;
  ::std::__cxx11::string::string((string *)in_RDI);
  ::std::__cxx11::string::operator+=((string *)in_RDI,"<li>");
  CreateGridItem_abi_cxx11_((RenderTree *)node.ptr,(idx_t)__range2,(idx_t)__begin2._M_current);
  ::std::__cxx11::string::operator+=((string *)in_RDI,local_58);
  ::std::__cxx11::string::~string(local_58);
  local_60 = (RenderTreeNode *)
             RenderTree::GetNode(in_stack_ffffffffffffff48,(idx_t)in_stack_ffffffffffffff40,
                                 in_stack_ffffffffffffff38);
  __lhs = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(in_stack_ffffffffffffff40);
  bVar1 = ::std::
          vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
          ::empty((vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                   *)this_00);
  if (!bVar1) {
    ::std::__cxx11::string::operator+=((string *)in_RDI,"<ul class=\"list-inline\">");
    this = optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                     ((optional_ptr<duckdb::RenderTreeNode,_true> *)__lhs);
    local_68 = &this->child_positions;
    local_70._M_current =
         (Coordinate *)
         std::
         vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
         ::begin((vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                  *)this);
    local_78 = (Coordinate *)
               std::
               vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
               ::end((vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                      *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::RenderTreeNode::Coordinate_*,_std::vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>_>
                               *)__lhs,(__normal_iterator<duckdb::RenderTreeNode::Coordinate_*,_std::vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>_>
                                        *)this), bVar1) {
      local_80 = __gnu_cxx::
                 __normal_iterator<duckdb::RenderTreeNode::Coordinate_*,_std::vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>_>
                 ::operator*(&local_70);
      CreateTreeRecursive_abi_cxx11_(in_RDX,in_RCX,CONCAT17(uVar2,in_stack_ffffffffffffffd8));
      ::std::__cxx11::string::operator+=((string *)in_RDI,local_a0);
      ::std::__cxx11::string::~string(local_a0);
      __gnu_cxx::
      __normal_iterator<duckdb::RenderTreeNode::Coordinate_*,_std::vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>_>
      ::operator++(&local_70);
    }
    ::std::__cxx11::string::operator+=((string *)in_RDI,"</ul>");
  }
  ::std::__cxx11::string::operator+=((string *)in_RDI,"</li>");
  return this_00;
}

Assistant:

static string CreateTreeRecursive(RenderTree &root, idx_t x, idx_t y) {
	string result;

	result += "<li>";
	result += CreateGridItem(root, x, y);
	auto node = root.GetNode(x, y);
	if (!node->child_positions.empty()) {
		result += "<ul class=\"list-inline\">";
		for (auto &coord : node->child_positions) {
			result += CreateTreeRecursive(root, coord.x, coord.y);
		}
		result += "</ul>";
	}
	result += "</li>";
	return result;
}